

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O2

value_type * __thiscall
YAML::detail::iterator_base<YAML::detail::iterator_value>::operator*
          (value_type *__return_storage_ptr__,iterator_base<YAML::detail::iterator_value> *this)

{
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> local_d0;
  node *local_c0;
  node *local_b8;
  node *local_b0;
  Node local_a8;
  Node local_68;
  
  node_iterator_base<YAML::detail::node>::operator*(&this->m_iterator);
  if (local_b0 == (node *)0x0) {
    if ((local_c0 == (node *)0x0) || (local_b8 == (node *)0x0)) {
      memset(__return_storage_ptr__,0,0xc0);
      iterator_value::iterator_value(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,
               &(this->m_pMemory).
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>);
    Node::Node(&local_a8,local_c0,(shared_memory_holder *)&local_e0);
    std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,
               &(this->m_pMemory).
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>);
    Node::Node(&local_68,local_b8,(shared_memory_holder *)&local_f0);
    iterator_value::iterator_value(__return_storage_ptr__,&local_a8,&local_68);
    Node::~Node(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    Node::~Node(&local_a8);
    p_Var1 = &local_e0;
  }
  else {
    std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,
               &(this->m_pMemory).
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>);
    Node::Node(&local_a8,local_b0,(shared_memory_holder *)&local_d0);
    iterator_value::iterator_value(__return_storage_ptr__,&local_a8);
    Node::~Node(&local_a8);
    p_Var1 = &local_d0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return __return_storage_ptr__;
}

Assistant:

value_type operator*() const {
    const typename base_type::value_type& v = *m_iterator;
    if (v.pNode)
      return value_type(Node(*v, m_pMemory));
    if (v.first && v.second)
      return value_type(Node(*v.first, m_pMemory), Node(*v.second, m_pMemory));
    return value_type();
  }